

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O0

void jsonip::write<A>(ostream *os,A *t,bool indent)

{
  undefined7 in_register_00000011;
  undefined1 local_50 [8];
  writer<false> w_1;
  writer<true> w;
  bool indent_local;
  A *t_local;
  ostream *os_local;
  
  if (indent) {
    writer<true>::writer
              ((writer<true> *)&w_1.level,(UI *)os,
               (UI_STRING *)CONCAT71(in_register_00000011,indent));
    detail::struct_helper<A>::write<jsonip::writer<true>>((writer<true> *)&w_1.level,t);
  }
  else {
    writer<false>::writer
              ((writer<false> *)local_50,(UI *)os,(UI_STRING *)CONCAT71(in_register_00000011,indent)
              );
    detail::struct_helper<A>::write<jsonip::writer<false>>((writer<false> *)local_50,t);
  }
  return;
}

Assistant:

void write(std::ostream& os, const T& t, bool indent = true)
    {
        if (indent)
        {
            writer<true> w(os);
            detail::calculate_helper<T>::type::write(w, t);
        }
        else
        {
            writer<false> w(os);
            detail::calculate_helper<T>::type::write(w, t);
        }
    }